

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_byte.hpp
# Opt level: O2

ans_byte_encode *
ans_byte_encode::create(ans_byte_encode *__return_storage_ptr__,uint8_t *in_u8,size_t n)

{
  ushort uVar1;
  long lVar2;
  uint uVar3;
  unsigned_short uVar4;
  size_t i;
  size_t sVar5;
  array<unsigned_long,_256UL> freqs;
  
  memset(__return_storage_ptr__,0,0x1200);
  memset(&freqs,0,0x800);
  for (sVar5 = 0; n != sVar5; sVar5 = sVar5 + 1) {
    freqs._M_elems[in_u8[sVar5]] = freqs._M_elems[in_u8[sVar5]] + 1;
  }
  adjust_freqs(&__return_storage_ptr__->nfreqs,&freqs);
  uVar3 = 0;
  for (lVar2 = 0; lVar2 != 0x200; lVar2 = lVar2 + 2) {
    uVar3 = uVar3 + *(ushort *)((long)(__return_storage_ptr__->nfreqs)._M_elems + lVar2);
  }
  __return_storage_ptr__->frame_size = (ulong)uVar3;
  uVar4 = 0;
  for (lVar2 = 0x41; lVar2 != 0x241; lVar2 = lVar2 + 2) {
    (__return_storage_ptr__->nfreqs)._M_elems[lVar2 * 4 + -4] =
         *(unsigned_short *)((long)(__return_storage_ptr__->nfreqs)._M_elems + lVar2 + -0x41);
    (__return_storage_ptr__->nfreqs)._M_elems[lVar2 * 4 + -3] = uVar4;
    uVar1 = *(ushort *)((long)(__return_storage_ptr__->nfreqs)._M_elems + lVar2 + -0x41);
    uVar4 = uVar4 + uVar1;
    *(ulong *)((__return_storage_ptr__->nfreqs)._M_elems + lVar2 * 4) = (ulong)uVar1 << 0x24;
  }
  __return_storage_ptr__->lower_bound = (ulong)uVar3 << 4;
  return __return_storage_ptr__;
}

Assistant:

static ans_byte_encode create(const uint8_t* in_u8, size_t n)
    {
        ans_byte_encode model;
        std::array<uint64_t, constants::MAX_SIGMA> freqs { 0 };
        for (size_t i = 0; i < n; i++) {
            freqs[in_u8[i]]++;
        }
        model.nfreqs = adjust_freqs(freqs);
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        uint64_t cur_base = 0;
        uint64_t tmp = constants::K * constants::RADIX;
        for (size_t sym = 0; sym < constants::MAX_SIGMA; sym++) {
            model.table[sym].freq = model.nfreqs[sym];
            model.table[sym].base = cur_base;
            model.table[sym].sym_upper_bound = tmp * model.nfreqs[sym];
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }